

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_hadd_u_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  (env->active_fpu).fpr[wd].fs[0] =
       (uint)*(ushort *)((env->active_fpu).fpr + wt) +
       (uint)*(ushort *)((long)(env->active_fpu).fpr + lVar3 + 2);
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 4) =
       (uint)*(ushort *)((long)(env->active_fpu).fpr + lVar2 + 4) +
       (uint)*(ushort *)((long)(env->active_fpu).fpr + lVar3 + 6);
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       (uint)*(ushort *)((long)(env->active_fpu).fpr + lVar2 + 8) +
       (uint)*(ushort *)((long)(env->active_fpu).fpr + lVar3 + 10);
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       (uint)*(ushort *)((long)(env->active_fpu).fpr + lVar2 + 0xc) +
       (uint)*(ushort *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  return;
}

Assistant:

void helper_msa_hadd_u_w(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_hadd_u_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_hadd_u_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_hadd_u_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_hadd_u_df(DF_WORD, pws->w[3],  pwt->w[3]);
}